

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
* makePalsAsSpecified(tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                      *__return_storage_ptr__,
                     vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes)

{
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *pvVar1;
  pointer paVar2;
  FILE *__stream;
  pointer pPVar3;
  _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
  *p_Var4;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  pointer pPVar8;
  const_iterator pvVar9;
  const_iterator pvVar10;
  undefined4 extraout_var;
  const_iterator pvVar11;
  char *pcVar12;
  Palette *pal;
  Rgba *this;
  Palette *pPVar13;
  ulong uVar14;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> __it;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> __it_00;
  long lVar15;
  undefined1 *puVar16;
  Rgba *pRVar17;
  vector<Palette,_std::allocator<Palette>_> palettes;
  DefaultInitVec<size_t> mappings;
  pointer local_88;
  pointer local_80;
  vector<Palette,_std::allocator<Palette>_> local_78;
  ulong local_60;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *local_58;
  vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
  *local_38;
  
  local_58 = protoPalettes;
  local_38 = (_Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
              *)__return_storage_ptr__;
  std::vector<Palette,_std::allocator<Palette>_>::vector
            (&local_78,
             (long)options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_50);
  paVar2 = options.palSpec.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pPVar13 = local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
            super__Vector_impl_data._M_start;
  pvVar1 = local_58;
  for (pRVar17 = (options.palSpec.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems; local_58 = pvVar1,
      pRVar17 != paVar2->_M_elems; pRVar17 = pRVar17 + 4) {
    if (options.nbColorsPerPal != '\0') {
      uVar14 = 0;
      this = pRVar17;
      do {
        if (this->alpha < 0xf0) break;
        uVar6 = Rgba::cgbColor(this);
        (pPVar13->colors)._M_elems[uVar14] = uVar6;
        uVar14 = uVar14 + 1;
        this = this + 1;
      } while (uVar14 < options.nbColorsPerPal);
    }
    pPVar13 = pPVar13 + 1;
    pvVar1 = local_58;
  }
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector(&local_50,
           (long)(pvVar1->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_88);
  pPVar8 = (pvVar1->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar1->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar8) {
    local_60 = 0;
    uVar14 = 0;
    do {
      pPVar3 = local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_88 = pPVar8 + uVar14;
      lVar15 = (long)local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5;
      __it_00._M_current =
           local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_80 = local_88;
      if (0 < lVar15) {
        lVar15 = lVar15 + 1;
        do {
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it_00);
          __it._M_current = __it_00._M_current;
          pPVar8 = local_80;
          if (bVar5) goto LAB_0010e137;
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it_00._M_current + 1);
          __it._M_current = __it_00._M_current + 1;
          pPVar8 = local_80;
          if (bVar5) goto LAB_0010e137;
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it_00._M_current + 2);
          __it._M_current = __it_00._M_current + 2;
          pPVar8 = local_80;
          if (bVar5) goto LAB_0010e137;
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it_00._M_current + 3);
          __it._M_current = __it_00._M_current + 3;
          pPVar8 = local_80;
          if (bVar5) goto LAB_0010e137;
          __it_00._M_current = __it_00._M_current + 4;
          lVar15 = lVar15 + -1;
        } while (1 < lVar15);
      }
      pPVar8 = local_80;
      lVar15 = (long)pPVar3 - (long)__it_00._M_current >> 3;
      if (lVar15 == 1) {
LAB_0010e123:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                              *)&local_88,__it_00);
        __it._M_current = pPVar3;
        if (bVar5) {
          __it._M_current = __it_00._M_current;
        }
      }
      else {
        __it._M_current = __it_00._M_current;
        if (lVar15 == 2) {
LAB_0010e101:
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it);
          if (!bVar5) {
            __it_00._M_current = __it._M_current + 1;
            goto LAB_0010e123;
          }
        }
        else {
          __it._M_current = pPVar3;
          if ((lVar15 == 3) &&
             (bVar5 = __gnu_cxx::__ops::
                      _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                      ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                    *)&local_88,__it_00), __it._M_current = __it_00._M_current,
             !bVar5)) {
            __it._M_current = __it_00._M_current + 1;
            goto LAB_0010e101;
          }
        }
      }
LAB_0010e137:
      if (__it._M_current ==
          local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar5 = ProtoPalette::empty(pPVar8);
        if (bVar5) {
          __assert_fail("!protoPal.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                        ,0x260,"makePalsAsSpecified");
        }
        pvVar9 = ProtoPalette::begin(pPVar8);
        pvVar10 = ProtoPalette::end(pPVar8);
        pvVar11 = pvVar10;
        if (pvVar9 != pvVar10) {
          puVar16 = makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)
                    ::$_1::operator()<ProtoPalette>(ProtoPalette_const&)::buf;
          do {
            iVar7 = sprintf(puVar16,", $%04x",(ulong)*pvVar9);
            pvVar11 = (const_iterator)CONCAT44(extraout_var,iVar7);
            puVar16 = puVar16 + 7;
            pvVar9 = pvVar9 + 1;
          } while (pvVar9 != pvVar10);
        }
        local_60 = CONCAT71((int7)((ulong)pvVar11 >> 8),1);
        error("Could not fit tile colors [%s] in specified palettes",0x11f522);
      }
      local_50.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar14] =
           (long)__it._M_current -
           (long)local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
      uVar14 = uVar14 + 1;
      pPVar8 = (local_58->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(local_58->
                                    super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 3))
    ;
    if ((local_60 & 1) != 0) {
      pcVar12 = "s were";
      if ((long)local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                super__Vector_impl_data._M_start == 8) {
        pcVar12 = " was";
      }
      fprintf(_stderr,"note: The following palette%s specified:\n",pcVar12);
      local_80 = (pointer)local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                          super__Vector_impl_data._M_finish;
      pPVar13 = local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          __stream = _stderr;
          pvVar11 = Palette::begin(pPVar13);
          pvVar9 = Palette::end(pPVar13);
          if (pvVar11 != pvVar9) {
            puVar16 = makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)
                      ::$_1::operator()<Palette>(Palette_const&)::buf;
            do {
              sprintf(puVar16,", $%04x",(ulong)*pvVar11);
              puVar16 = puVar16 + 7;
              pvVar11 = pvVar11 + 1;
            } while (pvVar11 != pvVar9);
          }
          fprintf(__stream,"        [%s]\n",0x11f542);
          pPVar13 = pPVar13 + 1;
        } while ((pointer)pPVar13 != local_80);
      }
      giveUp();
    }
  }
  p_Var4 = local_38;
  std::
  _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
  ::
  _Tuple_impl<std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>&,std::vector<Palette,std::allocator<Palette>>&,void>
            (local_38,&local_50,&local_78);
  if (local_50.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.super__Vector_impl_data
      ._M_start != (Palette *)0x0) {
    operator_delete(local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
          *)p_Var4;
}

Assistant:

static std::tuple<DefaultInitVec<size_t>, std::vector<Palette>>
    makePalsAsSpecified(std::vector<ProtoPalette> const &protoPalettes) {
	// Convert the palette spec to actual palettes
	std::vector<Palette> palettes(options.palSpec.size());
	for (auto [spec, pal] : zip(options.palSpec, palettes)) {
		for (size_t i = 0; i < options.nbColorsPerPal && spec[i].isOpaque(); ++i) {
			pal[i] = spec[i].cgbColor();
		}
	}

	auto listColors = [](auto const &list) {
		static char buf[sizeof(", $XXXX, $XXXX, $XXXX, $XXXX")];
		char *ptr = buf;
		for (uint16_t cgbColor : list) {
			sprintf(ptr, ", $%04x", cgbColor);
			ptr += 7;
		}
		return &buf[2];
	};

	// Iterate through proto-palettes, and try mapping them to the specified palettes
	DefaultInitVec<size_t> mappings(protoPalettes.size());
	bool bad = false;
	for (size_t i = 0; i < protoPalettes.size(); ++i) {
		ProtoPalette const &protoPal = protoPalettes[i];
		// Find the palette...
		auto iter = std::find_if(palettes.begin(), palettes.end(), [&protoPal](Palette const &pal) {
			// ...which contains all colors in this proto-pal
			return std::all_of(protoPal.begin(), protoPal.end(), [&pal](uint16_t color) {
				return std::find(pal.begin(), pal.end(), color) != pal.end();
			});
		});

		if (iter == palettes.end()) {
			assert(!protoPal.empty());
			error("Could not fit tile colors [%s] in specified palettes", listColors(protoPal));
			bad = true;
		}
		mappings[i] = iter - palettes.begin(); // Bogus value, but whatever
	}
	if (bad) {
		fprintf(stderr, "note: The following palette%s specified:\n",
		        palettes.size() == 1 ? " was" : "s were");
		for (Palette const &pal : palettes) {
			fprintf(stderr, "        [%s]\n", listColors(pal));
		}
		giveUp();
	}

	return {mappings, palettes};
}